

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mesh_output_demo.cc
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ostream *poVar3;
  StructuredMeshBuilder *pSVar4;
  int selector;
  stringstream filename;
  undefined1 local_1f8 [48];
  element_type local_1c8 [2];
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LehrFEM++ demo: output of test meshes",0x25);
  local_1b8[0] = (test_utils)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "(test meshes from lf::mesh::test_utils::GenerateHybrid2DTestMesh()",0x42);
  local_1b8[0] = (test_utils)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1b8,1);
  selector = 0;
  do {
    lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)local_1b8,selector,1.0);
    uVar2 = local_1b8._8_8_;
    uVar1 = local_1b8._0_8_;
    local_1f8._0_8_ = local_1b8._0_8_;
    local_1f8._8_8_ = local_1b8._8_8_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#### Test mesh ",0xf);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,selector);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ####",5);
    local_1b8[0] = (test_utils)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b8,1);
    lf::mesh::utils::PrintInfo((ostream *)&std::cout,(Mesh *)uVar1,0xb);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"test_mesh_",10);
    std::ostream::operator<<((ostream *)(local_1b8 + 0x10),selector);
    std::__cxx11::stringbuf::str();
    writeMeshRenderingData((shared_ptr<const_lf::mesh::Mesh> *)local_1f8,(char *)local_1f8._32_8_);
    if ((element_type *)local_1f8._32_8_ != local_1c8) {
      operator_delete((void *)local_1f8._32_8_,(long)local_1c8[0]._vptr_Mesh + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)uVar2
        != (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    selector = selector + 1;
  } while (selector != 9);
  local_1f8._24_8_ = operator_new(0x60);
  *(undefined ***)local_1f8._24_8_ = &PTR_DimWorld_00276690;
  *(undefined4 *)(local_1f8._24_8_ + 8) = 2;
  *(long *)(local_1f8._24_8_ + 0x10) = 0;
  *(long *)(local_1f8._24_8_ + 0x18) = 0;
  *(long *)(local_1f8._24_8_ + 0x20) = 0;
  *(long *)(local_1f8._24_8_ + 0x28) = 0;
  *(long *)(local_1f8._24_8_ + 0x30) = 0;
  *(long *)(local_1f8._24_8_ + 0x38) = 0;
  *(long *)(local_1f8._24_8_ + 0x40) = 0;
  *(long *)(local_1f8._24_8_ + 0x48) = 0;
  *(long *)(local_1f8._24_8_ + 0x50) = 0;
  *(undefined1 *)(local_1f8._24_8_ + 0x58) = 1;
  lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
            ((TPTriagMeshBuilder *)local_1b8,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
             (local_1f8 + 0x18));
  if ((long *)local_1f8._24_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1f8._24_8_ + 0x38))();
  }
  local_1f8._24_8_ = 0.0;
  local_1f8._32_8_ = 0.0;
  local_1f8._40_8_ = 0.0;
  pSVar4 = lf::mesh::utils::StructuredMeshBuilder::
           setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
                     ((StructuredMeshBuilder *)local_1b8,
                      (Matrix<double,_2,_1,_0,_2,_1> *)(local_1f8 + 0x20));
  local_1f8._0_8_ = &DAT_3ff0000000000000;
  local_1f8._8_8_ = &DAT_3ff0000000000000;
  pSVar4 = lf::mesh::utils::StructuredMeshBuilder::
           setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>
                     (pSVar4,(Matrix<double,_2,_1,_0,_2,_1> *)local_1f8);
  pSVar4->num_of_x_cells_ = 2;
  pSVar4->num_of_y_cells_ = 2;
  lf::mesh::utils::TPTriagMeshBuilder::Build((TPTriagMeshBuilder *)local_1f8);
  uVar2 = local_1f8._8_8_;
  uVar1 = local_1f8._0_8_;
  local_1f8._32_8_ = local_1f8._0_8_;
  local_1f8._40_8_ = local_1f8._8_8_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#### Triangular tensor product 2x2 mesh #####",0x2d);
  local_1f8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1f8,1);
  lf::mesh::utils::PrintInfo((ostream *)&std::cout,(Mesh *)uVar1,0xb);
  writeMeshRenderingData((shared_ptr<const_lf::mesh::Mesh> *)(local_1f8 + 0x20),"tp_tria_mesh");
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  local_1b8._0_8_ = &PTR___cxa_pure_virtual_00275d28;
  if ((tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)local_1b8._8_8_
      != (_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)0x0) {
    (*(*(_func_int ***)local_1b8._8_8_)[7])();
  }
  return 0;
}

Assistant:

int main() {
  std::cout << "LehrFEM++ demo: output of test meshes" << '\n';
  std::cout << "(test meshes from "
               "lf::mesh::test_utils::GenerateHybrid2DTestMesh()"
            << '\n';
  for (int selector = 0;
       selector <= lf::mesh::test_utils::GenerateHybrid2DTestMesh_maxsel;
       selector++) {
    // Generates a small test meshes, more precisely described in the
    // documentation of the function GenerateHybrid2DTestMesh()
    const std::shared_ptr<const lf::mesh::Mesh> mesh_p =
        lf::mesh::test_utils::GenerateHybrid2DTestMesh(selector);
    // Output of mesh information
    std::cout << "#### Test mesh " << selector << " ####" << '\n';
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    std::stringstream filename;
    filename << "test_mesh_" << selector;
    writeMeshRenderingData(mesh_p, filename.str().c_str());
  }

  {
    // Initialize builder object
    lf::mesh::utils::TPTriagMeshBuilder builder(
        std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
    // Set mesh parameters following the Builder pattern
    // Domain is the unit square, two cells in every direction
    builder.setBottomLeftCorner(Eigen::Vector2d{0, 0})
        .setTopRightCorner(Eigen::Vector2d{1, 1})
        .setNumXCells(2)
        .setNumYCells(2);
    const std::shared_ptr<const lf::mesh::Mesh> mesh_p = builder.Build();
    // Output of mesh information
    std::cout << "#### Triangular tensor product 2x2 mesh #####" << '\n';
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    writeMeshRenderingData(mesh_p, "tp_tria_mesh");
  }
  return 0L;
}